

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_gif_out.c
# Opt level: O2

void gdImageGifAnimAddCtx
               (gdImagePtr im,gdIOCtxPtr out,int LocalCM,int LeftOfs,int TopOfs,int Delay,
               int Disposal,gdImagePtr previm)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  gdImagePtr im_00;
  long lVar6;
  long lVar7;
  gdImagePtr to;
  long lVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  gdImagePtr from;
  ulong uVar12;
  uint uVar13;
  byte bVar14;
  ulong uVar15;
  int local_c56c;
  long local_c568;
  ulong local_c560;
  uint local_c558;
  gdImagePtr local_c530;
  int colorMap [256];
  
  iVar10 = im->interlace;
  iVar11 = im->transparent;
  if (im->trueColor == 0) {
    local_c530 = (gdImagePtr)0x0;
  }
  else {
    im = gdImageCreatePaletteFromTrueColor(im,1,0x100);
    local_c530 = im;
    if (im == (gdImagePtr)0x0) {
      return;
    }
  }
  local_c56c = iVar11;
  local_c558 = TopOfs;
  if (previm != (gdImagePtr)0x0) {
    uVar5 = im->sy;
    if (previm->trueColor == 0) {
      im_00 = (gdImagePtr)0x0;
    }
    else {
      im_00 = gdImageCreatePaletteFromTrueColor(previm,1,0x100);
      previm = im_00;
      if (im_00 == (gdImagePtr)0x0) goto LAB_0011740e;
    }
    for (lVar6 = 0; lVar6 != 0x100; lVar6 = lVar6 + 1) {
      colorMap[lVar6] = -2;
    }
    local_c560 = 0;
    for (lVar6 = 0; uVar3 = im->sy, lVar6 < (int)uVar3; lVar6 = lVar6 + 1) {
      for (uVar15 = 0; (long)uVar15 < (long)im->sx; uVar15 = uVar15 + 1) {
        iVar2 = comparewithmap(previm,im,(uint)previm->pixels[lVar6][uVar15],
                               (uint)im->pixels[lVar6][uVar15],colorMap);
        if (iVar2 == 0) {
          uVar3 = im->sy;
          uVar5 = (uint)lVar6;
          local_c560 = uVar15;
          goto LAB_00116f2a;
        }
      }
    }
    lVar6 = 0;
LAB_00116f2a:
    LeftOfs = 1;
    local_c568._0_4_ = 0;
    uVar13 = 0;
    local_c56c = 0;
    local_c558 = LeftOfs;
    if (uVar3 == uVar5) {
LAB_001170c8:
      iVar2 = (uVar13 - LeftOfs) + 1;
      iVar11 = ((int)local_c568 - local_c558) + 1;
      to = gdImageCreate(iVar2,iVar11);
      if (to == (gdImagePtr)0x0) {
        if (im_00 != (gdImagePtr)0x0) {
          gdImageDestroy(im_00);
        }
        goto LAB_0011740e;
      }
      from = im;
      if (LocalCM < 1) {
        from = previm;
      }
      gdImagePaletteCopy(to,from);
      gdImageCopy(to,im,0,0,LeftOfs,local_c558,iVar2,iVar11);
      if (local_c530 != (gdImagePtr)0x0) {
        gdImageDestroy(local_c530);
      }
      local_c530 = to;
      if (-1 < local_c56c) {
        for (lVar6 = 0; lVar6 < to->sy; lVar6 = lVar6 + 1) {
          uVar15 = (ulong)(uint)to->sx;
          if (to->sx < 1) {
            uVar15 = 0;
          }
          for (uVar12 = 0; uVar15 != uVar12; uVar12 = uVar12 + 1) {
            if (previm->pixels[lVar6 + (int)local_c558][uVar12 + (long)LeftOfs] ==
                to->pixels[lVar6][uVar12]) {
              gdImageSetPixel(to,(int)uVar12,(int)lVar6,local_c56c);
              break;
            }
          }
        }
      }
    }
    else {
      lVar7 = (long)(int)uVar5;
      local_c568 = (long)(int)uVar3;
      while (lVar8 = local_c568 + -1, local_c568 = lVar6, uVar13 = (uint)local_c560, lVar7 < lVar8)
      {
        for (uVar15 = 0; local_c568 = lVar8, (long)uVar15 < (long)im->sx; uVar15 = uVar15 + 1) {
          iVar2 = comparewithmap(previm,im,(uint)previm->pixels[lVar8][uVar15],
                                 (uint)im->pixels[lVar8][uVar15],colorMap);
          if (iVar2 == 0) {
            uVar12 = local_c560;
            if ((uint)uVar15 < (uint)local_c560) {
              uVar12 = uVar15;
            }
            uVar1 = local_c560;
            if ((uint)local_c560 < (uint)uVar15) {
              uVar1 = uVar15;
            }
            local_c560 = uVar12 & 0xffffffff;
            uVar13 = (uint)uVar1;
            goto LAB_00116fd4;
          }
        }
      }
LAB_00116fd4:
      for (uVar15 = 0; lVar6 = lVar7, uVar12 = local_c560, uVar15 != (local_c560 & 0xffffffff);
          uVar15 = uVar15 + 1) {
        while (lVar6 <= (int)local_c568) {
          iVar2 = comparewithmap(previm,im,(uint)previm->pixels[lVar6][uVar15],
                                 (uint)im->pixels[lVar6][uVar15],colorMap);
          lVar6 = lVar6 + 1;
          uVar12 = uVar15;
          if (iVar2 == 0) goto LAB_00117045;
        }
      }
LAB_00117045:
      local_c560 = uVar12;
      lVar6 = (long)im->sx;
      while (lVar6 = lVar6 + -1, lVar8 = lVar7, (int)uVar13 < lVar6) {
        while (lVar8 <= (int)local_c568) {
          iVar2 = comparewithmap(previm,im,(uint)previm->pixels[lVar8][lVar6],
                                 (uint)im->pixels[lVar8][lVar6],colorMap);
          lVar8 = lVar8 + 1;
          if (iVar2 == 0) {
            uVar13 = (uint)lVar6;
            goto LAB_001170ac;
          }
        }
      }
LAB_001170ac:
      LeftOfs = (int)local_c560;
      local_c56c = iVar11;
      local_c558 = uVar5;
      if (((LeftOfs != 0) || (LeftOfs = 0, uVar5 != 0)) || (uVar13 != im->sx - 1U))
      goto LAB_001170c8;
      LeftOfs = 0;
      local_c558 = 0;
      if (-1 < iVar11 || (int)local_c568 != im->sy + -1) goto LAB_001170c8;
      local_c558 = 0;
      LeftOfs = 0;
      to = im;
    }
    if (im_00 != (gdImagePtr)0x0) {
      gdImageDestroy(im_00);
    }
    Disposal = 1;
    im = to;
  }
  iVar4 = colorstobpp(im->colorsTotal);
  iVar11 = im->sx;
  iVar2 = im->sy;
  memset(colorMap + 8,0,0xc4c0);
  uVar5 = 0;
  if (LeftOfs < 1) {
    LeftOfs = uVar5;
  }
  if ((int)local_c558 < 1) {
    local_c558 = uVar5;
  }
  iVar9 = 100;
  if (-1 < Delay) {
    iVar9 = Delay;
  }
  colorMap._16_8_ = (long)iVar2 * (long)iVar11;
  colorMap[6] = 0;
  bVar14 = (char)Disposal * '\x04';
  colorMap[2] = 0;
  colorMap[3] = 0;
  colorMap[0] = iVar11;
  colorMap[1] = iVar2;
  colorMap[7] = iVar10;
  gdPutC('!',out);
  gdPutC(0xf9,out);
  gdPutC('\x04',out);
  if (Disposal < 0) {
    bVar14 = 4;
  }
  gdPutC(bVar14 | (byte)~(byte)((uint)local_c56c >> 0x18) >> 7,out);
  gdPutC((uchar)iVar9,out);
  gdPutC((uchar)((uint)iVar9 >> 8),out);
  gdPutC((uchar)local_c56c,out);
  gdPutC('\0',out);
  gdPutC(',',out);
  gifPutWord(LeftOfs,out);
  gifPutWord(local_c558,out);
  gifPutWord(iVar11,out);
  gifPutWord(iVar2,out);
  uVar3 = iVar4 - 1U | 0x80;
  if (LocalCM < 1) {
    uVar3 = uVar5;
  }
  gdPutC((byte)uVar3 | (iVar10 != 0) << 6,out);
  if (0 < LocalCM) {
    for (lVar6 = 0; (uint)lVar6 >> ((byte)iVar4 & 0x1f) == 0; lVar6 = lVar6 + 1) {
      gdPutC((uchar)im->red[lVar6],out);
      gdPutC((uchar)im->green[lVar6],out);
      gdPutC((uchar)im->blue[lVar6],out);
    }
  }
  iVar10 = 2;
  if (2 < iVar4) {
    iVar10 = iVar4;
  }
  gdPutC((uchar)iVar10,out);
  compress(iVar10 + 1,out,im,(GifCtx *)colorMap);
  gdPutC('\0',out);
LAB_0011740e:
  if (local_c530 != (gdImagePtr)0x0) {
    gdImageDestroy(local_c530);
  }
  return;
}

Assistant:

BGD_DECLARE(void) gdImageGifAnimAddCtx(gdImagePtr im, gdIOCtxPtr out,
                                       int LocalCM, int LeftOfs, int TopOfs,
                                       int Delay, int Disposal,
                                       gdImagePtr previm)
{
	gdImagePtr pim = NULL, tim = im;
	int interlace, transparent, BitsPerPixel;
	interlace = im->interlace;
	transparent = im->transparent;

	/* Default is no local color map */
	if(LocalCM < 0) {
		LocalCM = 0;
	}

	if(im->trueColor) {
		/* Expensive, but the only way that produces an
			acceptable result: mix down to a palette
			based temporary image. */
		pim = gdImageCreatePaletteFromTrueColor(im, 1, 256);
		if (!pim) {
			return;
		}
		tim = pim;
	}

	if (previm) {
		/* create optimized animation.  Compare this image to
		   the previous image and crop the temporary copy of
		   current image to include only changed rectangular
		   area.  Also replace unchanged pixels inside this
		   area with transparent color.  Transparent color
		   needs to be already allocated!
		   Preconditions:
		   TopOfs, LeftOfs are assumed 0

		   Images should be of same size.  If not, a temporary
		   copy is made with the same size as previous image.

		*/
		gdImagePtr prev_pim = 0, prev_tim = previm;
		int x, y;
		int min_x = 0;
		int min_y = tim->sy;
		int max_x = 0;
		int max_y = 0;
		int colorMap[256];

		if (previm->trueColor) {
			prev_pim = gdImageCreatePaletteFromTrueColor(previm, 1, 256);
			if (!prev_pim) {
				goto fail_end;
			}
			prev_tim = prev_pim;
		}

		for (x = 0; x < 256; ++x) {
			colorMap[x] = -2;
		}

		/* First find bounding box of changed areas. */
		/* first find the top changed row */
		for (y = 0; y < tim->sy; ++y) {
			for (x = 0; x < tim->sx; ++x) {
				if (!comparewithmap(prev_tim, tim,
				                    prev_tim->pixels[y][x],
				                    tim->pixels[y][x],
				                    colorMap)) {
					min_y = max_y = y;
					min_x = max_x = x;
					goto break_top;
				}
			}
		}

break_top:
		if (tim->sy == min_y) {
			/* No changes in this frame!! Encode empty image. */
			transparent = 0;
			min_x = min_y = 1;
			max_x = max_y = 0;
		} else {
			/* Then the bottom row */
			for (y = tim->sy - 1; y > min_y; --y) {
				for (x = 0; x < tim->sx; ++x) {
					if (!comparewithmap
					        (prev_tim, tim,
					         prev_tim->pixels[y][x],
					         tim->pixels[y][x],
					         colorMap)) {
						max_y = y;
						if(x < min_x) {
							min_x = x;
						}
						if(x > max_x) {
							max_x = x;
						}
						goto break_bot;
					}
				}
			}

break_bot:
			/* left side */
			for (x = 0; x < min_x; ++x) {
				for (y = min_y; y <= max_y; ++y) {
					if (!comparewithmap
					        (prev_tim, tim,
					         prev_tim->pixels[y][x],
					         tim->pixels[y][x],
					         colorMap)) {
						min_x = x;
						goto break_left;
					}
				}
			}

break_left:
			/* right side */
			for (x = tim->sx - 1; x > max_x; --x) {
				for (y = min_y; y <= max_y; ++y) {
					if (!comparewithmap
					        (prev_tim, tim,
					         prev_tim->pixels[y][x],
					         tim->pixels[y][x],
					         colorMap)) {
						max_x = x;
						goto break_right;
					}
				}
			}

break_right:
			;
		}

		LeftOfs = min_x;
		TopOfs = min_y;
		Disposal = 1;

		/* Make a copy of the image with the new offsets.
		   But only if necessary. */
		if (min_x != 0 || max_x != tim->sx - 1
		        || min_y != 0 || max_y != tim->sy - 1
		        || transparent >= 0) {

			gdImagePtr pim2 = gdImageCreate(max_x-min_x + 1, max_y-min_y + 1);

			if (!pim2) {
				if (prev_pim) {
					gdImageDestroy(prev_pim);
				}
				goto fail_end;
			}

			gdImagePaletteCopy(pim2, LocalCM ? tim : prev_tim);
			gdImageCopy(pim2, tim, 0, 0, min_x, min_y,
			            max_x - min_x + 1, max_y - min_y + 1);

			if (pim) {
				gdImageDestroy(pim);
			}

			tim = pim = pim2;
		}

		/* now let's compare pixels for transparent
		   optimization.  But only if transparent is set. */
		if (transparent >= 0) {
			for(y = 0; y < tim->sy; ++y) {
				for (x = 0; x < tim->sx; ++x) {
					if(comparewithmap
					        (prev_tim, tim,
					         prev_tim->pixels[min_y + y][min_x + x],
					         tim->pixels[y][x], 0)) {
						gdImageSetPixel(tim, x, y, transparent);
						break;
					}
				}
			}
		}

		if(prev_pim) {
			gdImageDestroy(prev_pim);
		}
	}

	BitsPerPixel = colorstobpp(tim->colorsTotal);

	/* All set, let's do it. */
	GIFAnimEncode(
	    out, tim->sx, tim->sy, LeftOfs, TopOfs, interlace, transparent,
	    Delay, Disposal, BitsPerPixel,
	    LocalCM ? tim->red : 0, tim->green, tim->blue, tim);

fail_end:
	if(pim) {
		/* Destroy palette based temporary image. */
		gdImageDestroy(pim);
	}
}